

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jasper.c
# Opt level: O0

cmdopts_t * cmdopts_parse(int argc,char **argv)

{
  int iVar1;
  cmdopts_t *pcVar2;
  ulonglong uVar3;
  int c;
  cmdopts_t *cmdopts;
  char **argv_local;
  int argc_local;
  
  pcVar2 = (cmdopts_t *)malloc(0x2060);
  if (pcVar2 != (cmdopts_t *)0x0) {
    pcVar2->infile = (char *)0x0;
    pcVar2->infmt = -1;
    pcVar2->inopts = (char *)0x0;
    pcVar2->inoptsbuf[0] = '\0';
    pcVar2->outfile = (char *)0x0;
    pcVar2->outfmt = -1;
    pcVar2->outopts = (char *)0x0;
    pcVar2->outoptsbuf[0] = '\0';
    pcVar2->verbose = 0;
    pcVar2->version = 0;
    pcVar2->cmptno = -1;
    pcVar2->debug = 0;
    pcVar2->srgb = 0;
    while (iVar1 = jas_getopt(argc,argv,cmdopts_parse::cmdoptions), iVar1 != -1) {
      switch(iVar1) {
      case 0:
        cmdusage();
        break;
      case 1:
        pcVar2->verbose = 1;
        break;
      case 2:
        pcVar2->infile = _jas_optarg;
        break;
      case 3:
        iVar1 = jas_image_strtofmt(_jas_optarg);
        pcVar2->infmt = iVar1;
        if (iVar1 < 0) {
          fprintf(_stderr,"warning: ignoring invalid input format %s\n",_jas_optarg);
          pcVar2->infmt = -1;
        }
        break;
      case 4:
        addopt(pcVar2->inoptsbuf,0x1000,_jas_optarg);
        pcVar2->inopts = pcVar2->inoptsbuf;
        break;
      case 5:
        pcVar2->outfile = _jas_optarg;
        break;
      case 6:
        iVar1 = jas_image_strtofmt(_jas_optarg);
        pcVar2->outfmt = iVar1;
        if (iVar1 < 0) {
          fprintf(_stderr,"error: invalid output format %s\n",_jas_optarg);
          badusage();
        }
        break;
      case 7:
        addopt(pcVar2->outoptsbuf,0x1000,_jas_optarg);
        pcVar2->outopts = pcVar2->outoptsbuf;
        break;
      case 8:
        pcVar2->version = 1;
        break;
      case 9:
        iVar1 = atoi(_jas_optarg);
        pcVar2->debug = iVar1;
        break;
      case 10:
        iVar1 = atoi(_jas_optarg);
        pcVar2->cmptno = (long)iVar1;
        break;
      case 0xb:
        pcVar2->srgb = 1;
        break;
      case 0xc:
        uVar3 = strtoull(_jas_optarg,(char **)0x0,10);
        pcVar2->max_mem = uVar3;
        break;
      default:
        badusage();
      }
    }
    for (; _jas_optind < argc; _jas_optind = _jas_optind + 1) {
      fprintf(_stderr,"warning: ignoring bogus command line argument %s\n",argv[_jas_optind]);
    }
    if (pcVar2->version == 0) {
      if ((pcVar2->outfmt < 0) && (pcVar2->outfile != (char *)0x0)) {
        iVar1 = jas_image_fmtfromname(pcVar2->outfile);
        pcVar2->outfmt = iVar1;
        if (iVar1 < 0) {
          fprintf(_stderr,"error: cannot guess image format from output file name\n");
        }
      }
      if (pcVar2->outfmt < 0) {
        fprintf(_stderr,"error: no output format specified\n");
        badusage();
      }
    }
    return pcVar2;
  }
  fprintf(_stderr,"error: insufficient memory\n");
  exit(1);
}

Assistant:

cmdopts_t *cmdopts_parse(int argc, char **argv)
{
	enum {
		CMDOPT_HELP = 0,
		CMDOPT_VERBOSE,
		CMDOPT_INFILE,
		CMDOPT_INFMT,
		CMDOPT_INOPT,
		CMDOPT_OUTFILE,
		CMDOPT_OUTFMT,
		CMDOPT_OUTOPT,
		CMDOPT_VERSION,
		CMDOPT_DEBUG,
		CMDOPT_CMPTNO,
		CMDOPT_SRGB,
		CMDOPT_MAXMEM
	};

	static const jas_opt_t cmdoptions[] = {
		{CMDOPT_HELP, "help", 0},
		{CMDOPT_VERBOSE, "verbose", 0},
		{CMDOPT_INFILE, "input", JAS_OPT_HASARG},
		{CMDOPT_INFILE, "f", JAS_OPT_HASARG},
		{CMDOPT_INFMT, "input-format", JAS_OPT_HASARG},
		{CMDOPT_INFMT, "t", JAS_OPT_HASARG},
		{CMDOPT_INOPT, "input-option", JAS_OPT_HASARG},
		{CMDOPT_INOPT, "o", JAS_OPT_HASARG},
		{CMDOPT_OUTFILE, "output", JAS_OPT_HASARG},
		{CMDOPT_OUTFILE, "F", JAS_OPT_HASARG},
		{CMDOPT_OUTFMT, "output-format", JAS_OPT_HASARG},
		{CMDOPT_OUTFMT, "T", JAS_OPT_HASARG},
		{CMDOPT_OUTOPT, "output-option", JAS_OPT_HASARG},
		{CMDOPT_OUTOPT, "O", JAS_OPT_HASARG},
		{CMDOPT_VERSION, "version", 0},
		{CMDOPT_DEBUG, "debug-level", JAS_OPT_HASARG},
		{CMDOPT_CMPTNO, "cmptno", JAS_OPT_HASARG},
		{CMDOPT_SRGB, "force-srgb", 0},
		{CMDOPT_SRGB, "S", 0},
#if defined(JAS_DEFAULT_MAX_MEM_USAGE)
		{CMDOPT_MAXMEM, "memory-limit", JAS_OPT_HASARG},
#endif
		{-1, 0, 0}
	};

	cmdopts_t *cmdopts;
	int c;

	if (!(cmdopts = malloc(sizeof(cmdopts_t)))) {
		fprintf(stderr, "error: insufficient memory\n");
		exit(EXIT_FAILURE);
	}

	cmdopts->infile = 0;
	cmdopts->infmt = -1;
	cmdopts->inopts = 0;
	cmdopts->inoptsbuf[0] = '\0';
	cmdopts->outfile = 0;
	cmdopts->outfmt = -1;
	cmdopts->outopts = 0;
	cmdopts->outoptsbuf[0] = '\0';
	cmdopts->verbose = 0;
	cmdopts->version = 0;
	cmdopts->cmptno = -1;
	cmdopts->debug = 0;
	cmdopts->srgb = 0;
#if defined(JAS_DEFAULT_MAX_MEM_USAGE)
	cmdopts->max_mem = JAS_DEFAULT_MAX_MEM_USAGE;
#endif

	while ((c = jas_getopt(argc, argv, cmdoptions)) != EOF) {
		switch (c) {
		case CMDOPT_HELP:
			cmdusage();
			break;
		case CMDOPT_VERBOSE:
			cmdopts->verbose = 1;
			break;
		case CMDOPT_VERSION:
			cmdopts->version = 1;
			break;
		case CMDOPT_DEBUG:
			cmdopts->debug = atoi(jas_optarg);
			break;
		case CMDOPT_INFILE:
			cmdopts->infile = jas_optarg;
			break;
		case CMDOPT_INFMT:
			if ((cmdopts->infmt = jas_image_strtofmt(jas_optarg)) < 0) {
				fprintf(stderr, "warning: ignoring invalid input format %s\n",
				  jas_optarg);
				cmdopts->infmt = -1;
			}
			break;
		case CMDOPT_INOPT:
			addopt(cmdopts->inoptsbuf, OPTSMAX, jas_optarg);
			cmdopts->inopts = cmdopts->inoptsbuf;
			break;
		case CMDOPT_OUTFILE:
			cmdopts->outfile = jas_optarg;
			break;
		case CMDOPT_OUTFMT:
			if ((cmdopts->outfmt = jas_image_strtofmt(jas_optarg)) < 0) {
				fprintf(stderr, "error: invalid output format %s\n", jas_optarg);
				badusage();
			}
			break;
		case CMDOPT_OUTOPT:
			addopt(cmdopts->outoptsbuf, OPTSMAX, jas_optarg);
			cmdopts->outopts = cmdopts->outoptsbuf;
			break;
		case CMDOPT_CMPTNO:
			cmdopts->cmptno = atoi(jas_optarg);
			break;
		case CMDOPT_SRGB:
			cmdopts->srgb = 1;
			break;
		case CMDOPT_MAXMEM:
			cmdopts->max_mem = strtoull(jas_optarg, 0, 10);
			break;
		default:
			badusage();
			break;
		}
	}

	while (jas_optind < argc) {
		fprintf(stderr,
		  "warning: ignoring bogus command line argument %s\n",
		  argv[jas_optind]);
		++jas_optind;
	}

	if (cmdopts->version) {
		goto done;
	}

	if (cmdopts->outfmt < 0 && cmdopts->outfile) {
		if ((cmdopts->outfmt = jas_image_fmtfromname(cmdopts->outfile)) < 0) {
			fprintf(stderr,
			  "error: cannot guess image format from output file name\n");
		}
	}

	if (cmdopts->outfmt < 0) {
		fprintf(stderr, "error: no output format specified\n");
		badusage();
	}

done:
	return cmdopts;
}